

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O1

Result Wasm2cMain(Errors *errors)

{
  pointer ppSVar1;
  ulong uVar2;
  Stream *h_impl_stream_00;
  _Alloc_hider _Var3;
  ulong *header_name;
  pointer pFVar4;
  char cVar5;
  char cVar6;
  Result RVar7;
  wabt *pwVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  long *plVar12;
  char *extraout_RDX;
  wabt *extraout_RDX_00;
  ulong uVar13;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  Enum EVar15;
  FileStream *s;
  pointer pFVar16;
  uint __val;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  string_view sVar17;
  string_view sVar18;
  string_view sVar19;
  string header_impl_name_full;
  string __str_1;
  string header_name_full;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FileStream h_impl_stream;
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> c_stream_ptrs;
  FileStream h_stream;
  vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> c_streams;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ReadBinaryOptions options;
  Module module;
  long *local_588;
  wabt *local_580;
  long local_578;
  undefined8 uStack_570;
  ulong *local_568;
  uint local_560;
  undefined4 uStack_55c;
  ulong local_558 [2];
  long *local_548;
  wabt *local_540;
  long local_538;
  long lStack_530;
  ulong *local_528;
  long local_520;
  ulong local_518 [2];
  undefined1 local_508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [3];
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> local_4c8;
  undefined1 local_4a8 [16];
  undefined1 auStack_498 [48];
  vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> local_468;
  void *local_448;
  long lStack_440;
  long local_438;
  ReadBinaryOptions local_428;
  Module local_3f8;
  char *pcVar14;
  
  _Var3._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  if (s_num_outputs == 0) {
    Wasm2cMain();
    EVar15 = Error;
    goto LAB_00116d63;
  }
  local_448 = (void *)0x0;
  lStack_440 = 0;
  local_438 = 0;
  pwVar8 = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  sVar17._M_str = (char *)&local_448;
  sVar17._M_len = (size_t)_Var3._M_p;
  RVar7 = wabt::ReadFile(pwVar8,sVar17,in_RCX);
  EVar15 = Error;
  if (RVar7.enum_ != Error) {
    local_3f8.name._M_dataplus._M_p = (pointer)&local_3f8.name.field_2;
    local_3f8.loc.field_1.field_0.line = 0;
    local_3f8.loc.field_1._4_8_ = 0;
    local_3f8.loc.filename._M_len = 0;
    local_3f8.loc.filename._M_str._0_4_ = 0;
    local_3f8.loc.filename._M_str._4_4_ = 0;
    local_3f8.name._M_string_length = 0;
    local_3f8.name.field_2._M_local_buf[0] = '\0';
    local_3f8.fields.first_ = (ModuleField *)0x0;
    local_3f8.fields.last_ = (ModuleField *)0x0;
    local_3f8.fields.size_ = 0;
    local_3f8.num_tag_imports = 0;
    local_3f8.num_func_imports = 0;
    local_3f8.num_table_imports = 0;
    local_3f8.num_memory_imports = 0;
    local_3f8.num_global_imports = 0;
    memset(&local_3f8.tags,0,0x120);
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.func_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.func_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.global_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.global_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.export_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.export_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.type_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.type_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.table_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.table_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.memory_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.memory_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.data_segment_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.data_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.elem_segment_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = 1;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_element_count = 0;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header;
    local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    local_3f8.elem_segment_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_single_bucket._0_7_ = 0;
    local_3f8._903_4_ = 0;
    local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_428.read_debug_names = (bool)(s_read_debug_names ^ 1);
    local_428.features.exceptions_enabled_ = s_write_c_options.features.exceptions_enabled_;
    local_428.features.mutable_globals_enabled_ =
         s_write_c_options.features.mutable_globals_enabled_;
    local_428.features.sat_float_to_int_enabled_ =
         s_write_c_options.features.sat_float_to_int_enabled_;
    local_428.features.sign_extension_enabled_ = s_write_c_options.features.sign_extension_enabled_;
    local_428.features.simd_enabled_ = s_write_c_options.features.simd_enabled_;
    local_428.features.threads_enabled_ = s_write_c_options.features.threads_enabled_;
    local_428.features.function_references_enabled_ =
         s_write_c_options.features.function_references_enabled_;
    local_428.features.multi_value_enabled_ = s_write_c_options.features.multi_value_enabled_;
    local_428.features.tail_call_enabled_ = s_write_c_options.features.tail_call_enabled_;
    local_428.features.bulk_memory_enabled_ = s_write_c_options.features.bulk_memory_enabled_;
    local_428.features.reference_types_enabled_ =
         s_write_c_options.features.reference_types_enabled_;
    local_428.features.annotations_enabled_ = s_write_c_options.features.annotations_enabled_;
    local_428.features.code_metadata_enabled_ = s_write_c_options.features.code_metadata_enabled_;
    local_428.features.gc_enabled_ = s_write_c_options.features.gc_enabled_;
    local_428.features.memory64_enabled_ = s_write_c_options.features.memory64_enabled_;
    local_428.features.multi_memory_enabled_ = s_write_c_options.features.multi_memory_enabled_;
    local_428.features.extended_const_enabled_ = s_write_c_options.features.extended_const_enabled_;
    local_428.features.relaxed_simd_enabled_ = s_write_c_options.features.relaxed_simd_enabled_;
    local_428.features.custom_page_sizes_enabled_ =
         s_write_c_options.features.custom_page_sizes_enabled_;
    local_428.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_428.stop_on_first_error = true;
    local_428.fail_on_custom_section_error = true;
    local_428.skip_function_bodies = false;
    local_3f8.tag_bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets =
         &local_3f8.tag_bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_single_bucket;
    local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3f8.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    RVar7 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,local_448,
                               lStack_440 - (long)local_448,&local_428,errors,&local_3f8);
    EVar15 = Error;
    if (RVar7.enum_ != Error) {
      local_4a8[0] = s_write_c_options.features.exceptions_enabled_;
      local_4a8[1] = s_write_c_options.features.mutable_globals_enabled_;
      local_4a8[2] = s_write_c_options.features.sat_float_to_int_enabled_;
      local_4a8[3] = s_write_c_options.features.sign_extension_enabled_;
      local_4a8[4] = s_write_c_options.features.simd_enabled_;
      local_4a8[5] = s_write_c_options.features.threads_enabled_;
      local_4a8[6] = s_write_c_options.features.function_references_enabled_;
      local_4a8[7] = s_write_c_options.features.multi_value_enabled_;
      local_4a8[8] = s_write_c_options.features.tail_call_enabled_;
      local_4a8[9] = s_write_c_options.features.bulk_memory_enabled_;
      local_4a8[10] = s_write_c_options.features.reference_types_enabled_;
      local_4a8[0xb] = s_write_c_options.features.annotations_enabled_;
      local_4a8[0xc] = s_write_c_options.features.code_metadata_enabled_;
      local_4a8[0xd] = s_write_c_options.features.gc_enabled_;
      local_4a8[0xe] = s_write_c_options.features.memory64_enabled_;
      stack0xfffffffffffffb67 = s_write_c_options.features._15_4_;
      RVar7 = wabt::ValidateModule(&local_3f8,errors,(ValidateOptions *)local_4a8);
      if (RVar7.enum_ != Error) {
        RVar7 = wabt::GenerateNames(&local_3f8,None);
        if (RVar7.enum_ != Error) {
          wabt::ApplyNames(&local_3f8);
          if (s_outfile_abi_cxx11_._M_string_length == 0) {
            wabt::FileStream::FileStream((FileStream *)local_4a8,_stdout,(Stream *)0x0);
            local_508._0_8_ = (pointer)0x0;
            local_508._8_8_ = (pointer)0x0;
            local_4f8[0]._M_allocated_capacity = (pointer)0x0;
            local_508._0_8_ = operator_new(8);
            local_508._8_8_ = local_508._0_8_ + 8;
            *(FileStream **)local_508._0_8_ = (FileStream *)local_4a8;
            local_4f8[0]._0_8_ = local_508._8_8_;
            RVar7 = wabt::WriteC((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)
                                 local_508,(Stream *)local_4a8,(Stream *)local_4a8,"wasm.h","",
                                 &local_3f8,&s_write_c_options);
            if ((pointer)local_508._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_508._0_8_,
                              local_4f8[0]._M_allocated_capacity - local_508._0_8_);
            }
            EVar15 = (Enum)(RVar7.enum_ == Error);
            wabt::FileStream::~FileStream((FileStream *)local_4a8);
          }
          else {
            sVar18._M_str = extraout_RDX;
            sVar18._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
            sVar17 = wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,sVar18);
            local_4a8._0_8_ = (FileStream *)auStack_498;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4a8,sVar17._M_str,sVar17._M_str + sVar17._M_len);
            plVar9 = (long *)std::__cxx11::string::append((char *)local_4a8);
            local_548 = &local_538;
            plVar12 = plVar9 + 2;
            if ((long *)*plVar9 == plVar12) {
              local_538 = *plVar12;
              lStack_530 = plVar9[3];
            }
            else {
              local_538 = *plVar12;
              local_548 = (long *)*plVar9;
            }
            pwVar8 = (wabt *)plVar9[1];
            *plVar9 = (long)plVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            local_540 = pwVar8;
            if ((FileStream *)local_4a8._0_8_ != (FileStream *)auStack_498) {
              operator_delete((void *)local_4a8._0_8_,
                              CONCAT53(auStack_498._3_5_,auStack_498._0_3_) + 1);
              pwVar8 = extraout_RDX_00;
            }
            local_468.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
            _M_impl.super__Vector_impl_data._M_start = (FileStream *)0x0;
            local_468.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
            _M_impl.super__Vector_impl_data._M_finish = (FileStream *)0x0;
            local_468.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (s_num_outputs == 1) {
              local_4a8._0_8_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
              std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
              emplace_back<char_const*>
                        ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)&local_468,
                         (char **)local_4a8);
            }
            else {
              filename._M_str = (char *)pwVar8;
              filename._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
              sVar17 = wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename);
              local_4a8._0_8_ = (FileStream *)auStack_498;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4a8,sVar17._M_str,sVar17._M_str + sVar17._M_len);
              if (s_num_outputs != 0) {
                __val = 0;
                do {
                  local_528 = local_518;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_528,local_4a8._0_8_,
                             (pointer)((long)&((Stream *)local_4a8._0_8_)->_vptr_Stream +
                                      CONCAT17(local_4a8[0xf],local_4a8._8_7_)));
                  std::__cxx11::string::append((char *)&local_528);
                  cVar6 = '\x01';
                  if (9 < __val) {
                    uVar13 = (ulong)__val;
                    cVar5 = '\x04';
                    do {
                      cVar6 = cVar5;
                      uVar11 = (uint)uVar13;
                      if (uVar11 < 100) {
                        cVar6 = cVar6 + -2;
                        goto LAB_0011675d;
                      }
                      if (uVar11 < 1000) {
                        cVar6 = cVar6 + -1;
                        goto LAB_0011675d;
                      }
                      if (uVar11 < 10000) goto LAB_0011675d;
                      uVar13 = uVar13 / 10000;
                      cVar5 = cVar6 + '\x04';
                    } while (99999 < uVar11);
                    cVar6 = cVar6 + '\x01';
                  }
LAB_0011675d:
                  local_568 = local_558;
                  std::__cxx11::string::_M_construct((ulong)&local_568,cVar6);
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_568,local_560,__val)
                  ;
                  uVar13 = 0xf;
                  if (local_528 != local_518) {
                    uVar13 = local_518[0];
                  }
                  uVar2 = CONCAT44(uStack_55c,local_560) + local_520;
                  if (uVar13 < uVar2) {
                    uVar13 = 0xf;
                    if (local_568 != local_558) {
                      uVar13 = local_558[0];
                    }
                    if (uVar13 < uVar2) goto LAB_001167c1;
                    puVar10 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_568,0,(char *)0x0,(ulong)local_528);
                  }
                  else {
LAB_001167c1:
                    puVar10 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_568);
                  }
                  local_588 = &local_578;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_578 = *plVar9;
                    uStack_570 = puVar10[3];
                  }
                  else {
                    local_578 = *plVar9;
                    local_588 = (long *)*puVar10;
                  }
                  local_580 = (wabt *)puVar10[1];
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)plVar9 = 0;
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_588);
                  ppSVar1 = (pointer)(plVar9 + 2);
                  if ((pointer)*plVar9 == ppSVar1) {
                    local_4f8[0]._0_8_ = *ppSVar1;
                    local_4f8[0]._8_8_ = plVar9[3];
                    local_508._0_8_ = local_508 + 0x10;
                  }
                  else {
                    local_4f8[0]._0_8_ = *ppSVar1;
                    local_508._0_8_ = (pointer)*plVar9;
                  }
                  local_508._8_8_ = plVar9[1];
                  *plVar9 = (long)ppSVar1;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)&local_468
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_508);
                  if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
                    operator_delete((void *)local_508._0_8_,
                                    (ulong)(local_4f8[0]._M_allocated_capacity + 1));
                  }
                  if (local_588 != &local_578) {
                    operator_delete(local_588,local_578 + 1);
                  }
                  if (local_568 != local_558) {
                    operator_delete(local_568,local_558[0] + 1);
                  }
                  if (local_528 != local_518) {
                    operator_delete(local_528,local_518[0] + 1);
                  }
                  __val = __val + 1;
                } while (__val < s_num_outputs);
              }
              if ((FileStream *)local_4a8._0_8_ != (FileStream *)auStack_498) {
                operator_delete((void *)local_4a8._0_8_,
                                CONCAT53(auStack_498._3_5_,auStack_498._0_3_) + 1);
              }
            }
            pFVar4 = local_468.
                     super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_468.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_468.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pFVar16 = local_468.
                        super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                local_4a8._0_8_ = pFVar16;
                std::vector<wabt::Stream*,std::allocator<wabt::Stream*>>::
                emplace_back<wabt::FileStream*>
                          ((vector<wabt::Stream*,std::allocator<wabt::Stream*>> *)&local_4c8,
                           (FileStream **)local_4a8);
                pFVar16 = pFVar16 + 1;
              } while (pFVar16 != pFVar4);
            }
            filename_00._M_str = (char *)local_548;
            filename_00._M_len = (size_t)local_540;
            wabt::FileStream::FileStream((FileStream *)local_4a8,filename_00,(Stream *)0x0);
            filename_01._M_str = extraout_RDX_01;
            filename_01._M_len = (size_t)local_548;
            sVar17 = wabt::GetBasename(local_540,filename_01);
            sVar19._M_str = s_write_c_options.module_name._M_str;
            sVar19._M_len = s_write_c_options.module_name._M_len;
            filename_02._M_str = sVar17._M_str;
            pcVar14 = filename_02._M_str;
            if (s_write_c_options.module_name._M_len == 0) {
              s_write_c_options.module_name._M_len = local_3f8.name._M_string_length;
              s_write_c_options.module_name._M_str = local_3f8.name._M_dataplus._M_p;
              sVar19._M_str = local_3f8.name._M_dataplus._M_p;
              sVar19._M_len = local_3f8.name._M_string_length;
              if (local_3f8.name._M_string_length == 0) {
                filename_02._M_len = (size_t)s_infile_abi_cxx11_._M_dataplus._M_p;
                sVar18 = wabt::GetBasename((wabt *)s_infile_abi_cxx11_._M_string_length,filename_02)
                ;
                filename_03._M_str = sVar18._M_str;
                filename_03._M_len = (size_t)filename_03._M_str;
                sVar19 = wabt::StripExtension((wabt *)sVar18._M_len,filename_03);
                pcVar14 = sVar19._M_str;
              }
            }
            s_write_c_options.module_name = sVar19;
            if (s_num_outputs == 1) {
              h_impl_stream_00 =
                   *local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              local_508._0_8_ = local_508 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_508,filename_02._M_str,filename_02._M_str + sVar17._M_len);
              RVar7 = wabt::WriteC(&local_4c8,(Stream *)local_4a8,h_impl_stream_00,
                                   (char *)local_508._0_8_,"",&local_3f8,&s_write_c_options);
              if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
                operator_delete((void *)local_508._0_8_,
                                (ulong)(local_4f8[0]._M_allocated_capacity + 1));
              }
              if (RVar7.enum_ == Error) {
LAB_00116c7d:
                wabt::FileStream::~FileStream((FileStream *)local_4a8);
                if (local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_4c8.
                                  super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_4c8.
                                        super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_4c8.
                                        super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::~vector
                          (&local_468);
                if (local_548 != &local_538) {
                  operator_delete(local_548,local_538 + 1);
                }
                goto LAB_00116d39;
              }
            }
            else {
              filename_04._M_str = pcVar14;
              filename_04._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
              sVar18 = wabt::StripExtension
                                 ((wabt *)s_outfile_abi_cxx11_._M_string_length,filename_04);
              local_508._0_8_ = local_508 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_508,sVar18._M_str,sVar18._M_str + sVar18._M_len);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_508);
              local_588 = &local_578;
              plVar9 = puVar10 + 2;
              if ((long *)*puVar10 == plVar9) {
                local_578 = *plVar9;
                uStack_570 = puVar10[3];
              }
              else {
                local_578 = *plVar9;
                local_588 = (long *)*puVar10;
              }
              local_580 = (wabt *)puVar10[1];
              *puVar10 = plVar9;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
                operator_delete((void *)local_508._0_8_,
                                (ulong)(local_4f8[0]._M_allocated_capacity + 1));
              }
              filename_05._M_str = (char *)local_588;
              filename_05._M_len = (size_t)local_580;
              wabt::FileStream::FileStream((FileStream *)local_508,filename_05,(Stream *)0x0);
              filename_06._M_str = extraout_RDX_02;
              filename_06._M_len = (size_t)local_588;
              sVar18 = wabt::GetBasename(local_580,filename_06);
              local_528 = local_518;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_528,filename_02._M_str,filename_02._M_str + sVar17._M_len)
              ;
              header_name = local_528;
              local_568 = local_558;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_568,sVar18._M_str,sVar18._M_str + sVar18._M_len);
              RVar7 = wabt::WriteC(&local_4c8,(Stream *)local_4a8,(Stream *)local_508,
                                   (char *)header_name,(char *)local_568,&local_3f8,
                                   &s_write_c_options);
              if (local_568 != local_558) {
                operator_delete(local_568,local_558[0] + 1);
              }
              if (local_528 != local_518) {
                operator_delete(local_528,local_518[0] + 1);
              }
              wabt::FileStream::~FileStream((FileStream *)local_508);
              if (RVar7.enum_ == Error) {
                if (local_588 != &local_578) {
                  operator_delete(local_588,local_578 + 1);
                }
                goto LAB_00116c7d;
              }
              if (local_588 != &local_578) {
                operator_delete(local_588,local_578 + 1);
              }
            }
            wabt::FileStream::~FileStream((FileStream *)local_4a8);
            if (local_4c8.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4c8.
                              super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_4c8.
                                    super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_4c8.
                                    super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::~vector(&local_468);
            if (local_548 != &local_538) {
              operator_delete(local_548,local_538 + 1);
            }
            EVar15 = Ok;
          }
        }
      }
    }
LAB_00116d39:
    wabt::Module::~Module(&local_3f8);
  }
  if (local_448 != (void *)0x0) {
    operator_delete(local_448,local_438 - (long)local_448);
  }
LAB_00116d63:
  return (Result)EVar15;
}

Assistant:

Result Wasm2cMain(Errors& errors) {
  if (s_num_outputs < 1) {
    fprintf(stderr, "Number of output files must be positive.\n");
    return Result::Error;
  }

  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(s_infile.c_str(), &file_data));

  Module module;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_write_c_options.features, s_log_stream.get(),
                            s_read_debug_names, kStopOnFirstError,
                            kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryIr(s_infile.c_str(), file_data.data(),
                            file_data.size(), options, &errors, &module));
  CHECK_RESULT(ValidateModule(&module, &errors, s_write_c_options.features));
  CHECK_RESULT(GenerateNames(&module));
  /* TODO(binji): This shouldn't fail; if a name can't be applied
   * (because the index is invalid, say) it should just be skipped. */
  ApplyNames(&module);

  if (!s_outfile.empty()) {
    std::string header_name_full =
        std::string(wabt::StripExtension(s_outfile)) + ".h";
    std::vector<FileStream> c_streams;
    if (s_num_outputs == 1) {
      c_streams.emplace_back(s_outfile.c_str());
    } else {
      std::string output_prefix{wabt::StripExtension(s_outfile)};
      for (unsigned int i = 0; i < s_num_outputs; i++) {
        c_streams.emplace_back(output_prefix + "_" + std::to_string(i) + ".c");
      }
    }
    std::vector<Stream*> c_stream_ptrs;
    for (auto& s : c_streams) {
      c_stream_ptrs.emplace_back(&s);
    }
    FileStream h_stream(header_name_full);
    std::string_view header_name = GetBasename(header_name_full);
    if (s_write_c_options.module_name.empty()) {
      s_write_c_options.module_name = module.name;
      if (s_write_c_options.module_name.empty()) {
        // In the absence of module name in the names section use the filename.
        s_write_c_options.module_name = StripExtension(GetBasename(s_infile));
      }
    }
    if (s_num_outputs == 1) {
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, c_stream_ptrs[0],
                          std::string(header_name).c_str(), "", &module,
                          s_write_c_options));
    } else {
      std::string header_impl_name_full =
          std::string(wabt::StripExtension(s_outfile)) + "-impl.h";
      FileStream h_impl_stream(header_impl_name_full);
      std::string_view header_impl_name = GetBasename(header_impl_name_full);
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, &h_impl_stream,
                          std::string(header_name).c_str(),
                          std::string(header_impl_name).c_str(), &module,
                          s_write_c_options));
    }
  } else {
    FileStream stream(stdout);
    CHECK_RESULT(WriteC({&stream}, &stream, &stream, "wasm.h", "", &module,
                        s_write_c_options));
  }

  return Result::Ok;
}